

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3ExprAssignVarNumber(Parse *pParse,Expr *pExpr,u32 n)

{
  undefined2 uVar1;
  int iVar2;
  sqlite3 *db;
  char *zName;
  VList *pVVar3;
  bool bVar4;
  uint uVar5;
  long lVar6;
  int *piVar7;
  short sVar8;
  ulong uVar9;
  size_t __n;
  int *piVar10;
  u32 uVar11;
  int iVar12;
  int *piVar13;
  bool bVar14;
  i64 i;
  ulong local_50;
  ulong local_48;
  Expr *local_40;
  char *local_38;
  
  if (pExpr == (Expr *)0x0) {
    return;
  }
  db = pParse->db;
  zName = (pExpr->u).zToken;
  if ((long)zName[1] == 0) {
    uVar1 = pParse->nVar;
    sVar8 = uVar1 + 1;
    pParse->nVar = sVar8;
    goto LAB_00179924;
  }
  local_38 = zName;
  if (*zName == '?') {
    if (n == 2) {
      local_50 = (long)zName[1] - 0x30;
      bVar14 = false;
    }
    else {
      iVar12 = sqlite3Atoi64(zName + 1,(i64 *)&local_50,n - 1,'\x01');
      bVar14 = iVar12 != 0;
    }
    uVar9 = local_50;
    if (((long)local_50 < 1 || bVar14) || ((long)db->aLimit[9] < (long)local_50)) {
      bVar4 = false;
      sqlite3ErrorMsg(pParse,"variable number must be between ?1 and ?%d",(ulong)(uint)db->aLimit[9]
                     );
      bVar14 = false;
    }
    else {
      sVar8 = (short)local_50;
      if (pParse->nVar < sVar8) {
        pParse->nVar = sVar8;
        bVar14 = true;
        bVar4 = true;
      }
      else {
        pVVar3 = pParse->pVList;
        bVar14 = true;
        bVar4 = true;
        if (pVVar3 != (VList *)0x0) {
          iVar12 = 2;
          do {
            piVar10 = pVVar3 + iVar12;
            if (*piVar10 == (int)sVar8) {
              bVar14 = piVar10 == (int *)0xfffffffffffffff8;
              break;
            }
            iVar12 = iVar12 + piVar10[1];
          } while (iVar12 < pVVar3[1]);
        }
      }
    }
    if (bVar4) goto LAB_0017983a;
    bVar4 = false;
  }
  else {
    uVar5 = sqlite3VListNameToNum(pParse->pVList,zName,n);
    uVar9 = (ulong)uVar5;
    bVar14 = false;
    if ((short)uVar5 == 0) {
      uVar5 = *(int *)&pParse->nVar + 1;
      uVar9 = (ulong)uVar5;
      pParse->nVar = (ynVar)uVar5;
      bVar14 = true;
    }
LAB_0017983a:
    bVar4 = true;
    if (bVar14) {
      uVar11 = n + 3;
      if (-1 < (int)n) {
        uVar11 = n;
      }
      piVar10 = pParse->pVList;
      iVar12 = ((int)uVar11 >> 2) + 3;
      piVar13 = piVar10;
      local_48 = (ulong)n;
      local_40 = pExpr;
      if (piVar10 == (int *)0x0) {
        lVar6 = 10;
LAB_00179894:
        piVar7 = (int *)sqlite3DbRealloc(db,piVar10,(iVar12 + lVar6) * 4);
        if (piVar7 != (int *)0x0) {
          if (piVar10 == (int *)0x0) {
            piVar7[1] = 2;
          }
          *piVar7 = (int)(iVar12 + lVar6);
          piVar13 = piVar7;
        }
        if (piVar7 != (int *)0x0) goto LAB_001798d2;
      }
      else {
        if (*piVar10 < piVar10[1] + iVar12) {
          lVar6 = (long)*piVar10 * 2;
          goto LAB_00179894;
        }
LAB_001798d2:
        piVar10 = piVar13;
        iVar2 = piVar10[1];
        piVar13 = piVar10 + iVar2;
        *piVar13 = (int)(short)uVar9;
        piVar13[1] = iVar12;
        piVar10[1] = iVar12 + iVar2;
        __n = (size_t)(int)local_48;
        memcpy(piVar13 + 2,local_38,__n);
        *(undefined1 *)((long)piVar10 + __n + 8 + (long)iVar2 * 4) = 0;
      }
      pParse->pVList = piVar10;
      bVar4 = true;
      pExpr = local_40;
    }
  }
  sVar8 = (short)uVar9;
  if (!bVar4) {
    return;
  }
LAB_00179924:
  pExpr->iColumn = sVar8;
  if ((int)sVar8 <= db->aLimit[9]) {
    return;
  }
  sqlite3ErrorMsg(pParse,"too many SQL variables");
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprAssignVarNumber(Parse *pParse, Expr *pExpr, u32 n){
  sqlite3 *db = pParse->db;
  const char *z;
  ynVar x;

  if( pExpr==0 ) return;
  assert( !ExprHasProperty(pExpr, EP_IntValue|EP_Reduced|EP_TokenOnly) );
  z = pExpr->u.zToken;
  assert( z!=0 );
  assert( z[0]!=0 );
  assert( n==(u32)sqlite3Strlen30(z) );
  if( z[1]==0 ){
    /* Wildcard of the form "?".  Assign the next variable number */
    assert( z[0]=='?' );
    x = (ynVar)(++pParse->nVar);
  }else{
    int doAdd = 0;
    if( z[0]=='?' ){
      /* Wildcard of the form "?nnn".  Convert "nnn" to an integer and
      ** use it as the variable number */
      i64 i;
      int bOk;
      if( n==2 ){ /*OPTIMIZATION-IF-TRUE*/
        i = z[1]-'0';  /* The common case of ?N for a single digit N */
        bOk = 1;
      }else{
        bOk = 0==sqlite3Atoi64(&z[1], &i, n-1, SQLITE_UTF8);
      }
      testcase( i==0 );
      testcase( i==1 );
      testcase( i==db->aLimit[SQLITE_LIMIT_VARIABLE_NUMBER]-1 );
      testcase( i==db->aLimit[SQLITE_LIMIT_VARIABLE_NUMBER] );
      if( bOk==0 || i<1 || i>db->aLimit[SQLITE_LIMIT_VARIABLE_NUMBER] ){
        sqlite3ErrorMsg(pParse, "variable number must be between ?1 and ?%d",
            db->aLimit[SQLITE_LIMIT_VARIABLE_NUMBER]);
        return;
      }
      x = (ynVar)i;
      if( x>pParse->nVar ){
        pParse->nVar = (int)x;
        doAdd = 1;
      }else if( sqlite3VListNumToName(pParse->pVList, x)==0 ){
        doAdd = 1;
      }
    }else{
      /* Wildcards like ":aaa", "$aaa" or "@aaa".  Reuse the same variable
      ** number as the prior appearance of the same name, or if the name
      ** has never appeared before, reuse the same variable number
      */
      x = (ynVar)sqlite3VListNameToNum(pParse->pVList, z, n);
      if( x==0 ){
        x = (ynVar)(++pParse->nVar);
        doAdd = 1;
      }
    }
    if( doAdd ){
      pParse->pVList = sqlite3VListAdd(db, pParse->pVList, z, n, x);
    }
  }
  pExpr->iColumn = x;
  if( x>db->aLimit[SQLITE_LIMIT_VARIABLE_NUMBER] ){
    sqlite3ErrorMsg(pParse, "too many SQL variables");
  }
}